

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

void p2sc_copy_file(char *from,char *to)

{
  int iVar1;
  GMappedFile *pGVar2;
  undefined8 uVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 in_RSI;
  char *dir;
  GMappedFile *map;
  GError *err;
  char *in_stack_ffffffffffffffc0;
  long local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  pGVar2 = p2sc_map_file(in_stack_ffffffffffffffc0);
  uVar3 = g_path_get_dirname(local_10);
  iVar1 = g_mkdir_with_parents(uVar3,0x1ed);
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    uVar5 = g_strerror(*piVar4);
    _p2sc_msg("p2sc_copy_file",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x169,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"mkdir(%s): %s",
              uVar3,uVar5);
    exit(1);
  }
  g_free(uVar3);
  uVar3 = local_10;
  uVar5 = g_mapped_file_get_contents(pGVar2);
  uVar6 = g_mapped_file_get_length(pGVar2);
  iVar1 = g_file_set_contents(uVar3,uVar5,uVar6,&local_18);
  if (iVar1 == 0) {
    if ((local_18 != 0) && (*(long *)(local_18 + 8) != 0)) {
      _p2sc_msg("p2sc_copy_file",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
                ,0x170,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"%s",
                *(undefined8 *)(local_18 + 8));
      exit(1);
    }
    _p2sc_msg("p2sc_copy_file",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x173,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s: file writing failed: unknown reason",local_10);
    exit(1);
  }
  g_mapped_file_unref(pGVar2);
  return;
}

Assistant:

void p2sc_copy_file(const char *from, const char *to) {
    GError *err = NULL;
    GMappedFile *map = p2sc_map_file(from);

    char *dir = g_path_get_dirname(to);
    if (g_mkdir_with_parents(dir, 0755))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "mkdir(%s): %s", dir, g_strerror(errno));
    g_free(dir);

    if (!g_file_set_contents(to,
                             g_mapped_file_get_contents(map),
                             g_mapped_file_get_length(map), &err)) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: file writing failed: unknown reason", to);
    }
    g_mapped_file_unref(map);
}